

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwebp.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  char *__s1;
  char *__s1_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int parse_error;
  uint8_t *data;
  size_t data_size;
  WebPDecoderConfig config;
  long local_180;
  char *local_160;
  uint local_158 [5];
  int local_144;
  undefined4 local_140;
  int local_13c;
  uint8_t *local_138;
  int local_12c;
  size_t local_128;
  WebPDecoderConfig local_120;
  
  local_138 = (uint8_t *)0x0;
  iVar3 = WebPInitDecoderConfigInternal(&local_120,0x210);
  if (iVar3 == 0) {
    main_cold_10();
    return 1;
  }
  if (argc < 2) goto LAB_00103156;
  local_13c = argc + -1;
  local_12c = argc + -4;
  local_144 = argc + -2;
  local_160 = (char *)0x0;
  iVar3 = 1;
  local_140 = 0;
  local_180 = 0;
LAB_001029b3:
  local_158[0] = 0;
  __s1 = argv[iVar3];
  cVar1 = *__s1;
  if (cVar1 == '-') {
    if (((__s1[1] == 'h') && (__s1[2] == '\0')) || (iVar4 = strcmp(__s1,"-help"), iVar4 == 0))
    goto LAB_00103070;
    if (__s1[1] != 'o') goto LAB_00102a45;
    bVar2 = iVar3 < local_13c;
    if ((__s1[2] != '\0') || (local_13c <= iVar3)) goto LAB_00102a4e;
    iVar3 = iVar3 + 1;
    __s1 = local_160;
  }
  else {
    iVar4 = strcmp(__s1,"-help");
    if (iVar4 == 0) {
LAB_00103070:
      puts(
          "Usage: dwebp in_file [options] [-o out_file]\n\nDecodes the WebP image file to PNG format [Default].\nNote: Animated WebP files are not supported.\n\nUse following options to convert into alternate image formats:\n  -pam ......... save the raw RGBA samples as a color PAM\n  -ppm ......... save the raw RGB samples as a color PPM\n  -bmp ......... save as uncompressed BMP format\n  -tiff ........ save as uncompressed TIFF format\n  -pgm ......... save the raw YUV samples as a grayscale PGM\n                 file with IMC4 layout\n  -yuv ......... save the raw YUV samples in flat layout\n\n Other options are:\n  -version ..... print version number and exit\n  -nofancy ..... don\'t use the fancy YUV420 upscaler\n  -nofilter .... disable in-loop filtering\n  -nodither .... disable dithering\n  -dither <d> .. dithering strength (in 0..100)\n  -alpha_dither  use alpha-plane dithering if needed\n  -mt .......... use multi-threading\n  -crop <x> <y> <w> <h> ... crop output with the given rectangle\n  -resize <w> <h> ......... resize output (*after* any cropping)\n  -flip ........ flip the output vertically\n  -alpha ....... only save the alpha plane\n  -incremental . use incremental decoding (useful for tests)\n  -h ........... this help message\n  -v ........... verbose (e.g. print encoding/decoding times)\n  -quiet ....... quiet mode, don\'t print anything\n  -noasm ....... disable all assembly optimizations"
          );
      return 0;
    }
LAB_00102a45:
    bVar2 = iVar3 < local_13c;
LAB_00102a4e:
    iVar4 = strcmp(__s1,"-alpha");
    if (iVar4 == 0) {
      local_180 = 7;
      __s1 = local_160;
      goto LAB_00102cd1;
    }
    iVar4 = strcmp(__s1,"-nofancy");
    if (iVar4 == 0) {
      local_120.options.no_fancy_upsampling = 1;
      __s1 = local_160;
      goto LAB_00102cd1;
    }
    iVar4 = strcmp(__s1,"-nofilter");
    if (iVar4 == 0) {
      local_120.options.bypass_filtering = 1;
      __s1 = local_160;
      goto LAB_00102cd1;
    }
    iVar4 = strcmp(__s1,"-pam");
    if (iVar4 == 0) {
      local_180 = 1;
      __s1 = local_160;
      goto LAB_00102cd1;
    }
    iVar4 = strcmp(__s1,"-ppm");
    if (iVar4 == 0) {
      local_180 = 2;
      __s1 = local_160;
      goto LAB_00102cd1;
    }
    iVar4 = strcmp(__s1,"-bmp");
    if (iVar4 == 0) {
      local_180 = 4;
      __s1 = local_160;
      goto LAB_00102cd1;
    }
    iVar4 = strcmp(__s1,"-tiff");
    if (iVar4 == 0) {
      local_180 = 5;
      __s1 = local_160;
      goto LAB_00102cd1;
    }
    iVar4 = strcmp(__s1,"-quiet");
    if (iVar4 == 0) {
      quiet = '\x01';
      __s1 = local_160;
      goto LAB_00102cd1;
    }
    iVar4 = strcmp(__s1,"-version");
    if (iVar4 == 0) {
      uVar5 = WebPGetDecoderVersion();
      printf("%d.%d.%d\n",(ulong)(uVar5 >> 0x10 & 0xff),(ulong)(uVar5 >> 8 & 0xff),
             (ulong)(uVar5 & 0xff));
      return 0;
    }
    iVar4 = strcmp(__s1,"-pgm");
    if (iVar4 == 0) {
      local_180 = 3;
      __s1 = local_160;
      goto LAB_00102cd1;
    }
    iVar4 = strcmp(__s1,"-yuv");
    if (iVar4 == 0) {
      local_180 = 6;
      __s1 = local_160;
      goto LAB_00102cd1;
    }
    iVar4 = strcmp(__s1,"-pixel_format");
    if ((bool)(iVar4 == 0 & bVar2)) {
      iVar6 = iVar3 + 1;
      __s1_00 = argv[(long)iVar3 + 1];
      iVar4 = strcmp(__s1_00,"RGB");
      iVar3 = iVar6;
      if (iVar4 == 0) {
        local_180 = 8;
        __s1 = local_160;
      }
      else {
        iVar4 = strcmp(__s1_00,"RGBA");
        if (iVar4 == 0) {
          local_180 = 9;
          __s1 = local_160;
        }
        else {
          iVar4 = strcmp(__s1_00,"BGR");
          if (iVar4 == 0) {
            local_180 = 10;
            __s1 = local_160;
          }
          else {
            iVar4 = strcmp(__s1_00,"BGRA");
            if (iVar4 == 0) {
              local_180 = 0xb;
              __s1 = local_160;
            }
            else {
              iVar4 = strcmp(__s1_00,"ARGB");
              if (iVar4 == 0) {
                local_180 = 0xc;
                __s1 = local_160;
              }
              else {
                iVar4 = strcmp(__s1_00,"RGBA_4444");
                if (iVar4 == 0) {
                  local_180 = 0xd;
                  __s1 = local_160;
                }
                else {
                  iVar4 = strcmp(__s1_00,"RGB_565");
                  if (iVar4 == 0) {
                    local_180 = 0xe;
                    __s1 = local_160;
                  }
                  else {
                    iVar4 = strcmp(__s1_00,"rgbA");
                    if (iVar4 == 0) {
                      local_180 = 0xf;
                      __s1 = local_160;
                    }
                    else {
                      iVar4 = strcmp(__s1_00,"bgrA");
                      if (iVar4 == 0) {
                        local_180 = 0x10;
                        __s1 = local_160;
                      }
                      else {
                        iVar4 = strcmp(__s1_00,"Argb");
                        if (iVar4 == 0) {
                          local_180 = 0x11;
                          __s1 = local_160;
                        }
                        else {
                          iVar4 = strcmp(__s1_00,"rgbA_4444");
                          if (iVar4 == 0) {
                            local_180 = 0x12;
                            __s1 = local_160;
                          }
                          else {
                            iVar4 = strcmp(__s1_00,"YUV");
                            if (iVar4 == 0) {
                              local_180 = 0x13;
                              __s1 = local_160;
                            }
                            else {
                              iVar4 = strcmp(__s1_00,"YUVA");
                              local_180 = 0x14;
                              __s1 = local_160;
                              if (iVar4 != 0) {
                                fprintf(stderr,"Can\'t parse pixel_format %s\n",__s1_00);
                                local_158[0] = 1;
                                goto LAB_001035f7;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_00102cd1;
    }
    iVar4 = strcmp(__s1,"-external_memory");
    if ((bool)(iVar4 == 0 & bVar2)) {
      iVar4 = iVar3 + 1;
      uVar5 = ExUtilGetInt(argv[(long)iVar3 + 1],0,(int *)local_158);
      local_158[0] = local_158[0] | 2 < uVar5;
      if (local_158[0] != 0) {
        main_cold_2();
        iVar3 = iVar4;
        __s1 = local_160;
        goto LAB_00102cd1;
      }
      goto LAB_00102cdc;
    }
    iVar4 = strcmp(__s1,"-mt");
    if (iVar4 == 0) {
      local_120.options.use_threads = 1;
      __s1 = local_160;
    }
    else {
      iVar4 = strcmp(__s1,"-alpha_dither");
      if (iVar4 == 0) {
        local_120.options.alpha_dithering_strength = 100;
        __s1 = local_160;
      }
      else {
        iVar4 = strcmp(__s1,"-nodither");
        if (iVar4 == 0) {
          local_120.options.dithering_strength = 0;
          __s1 = local_160;
        }
        else {
          iVar4 = strcmp(__s1,"-dither");
          if ((bool)(iVar4 == 0 & bVar2)) {
            local_120.options.dithering_strength =
                 ExUtilGetInt(argv[(long)iVar3 + 1],0,(int *)local_158);
            iVar3 = iVar3 + 1;
            __s1 = local_160;
          }
          else {
            iVar4 = strcmp(__s1,"-crop");
            if (iVar3 < local_12c && iVar4 == 0) {
              local_120.options.use_cropping = 1;
              local_120.options.crop_left = ExUtilGetInt(argv[(long)iVar3 + 1],0,(int *)local_158);
              local_120.options.crop_top = ExUtilGetInt(argv[(long)iVar3 + 2],0,(int *)local_158);
              local_120.options.crop_width = ExUtilGetInt(argv[(long)iVar3 + 3],0,(int *)local_158);
              local_120.options.crop_height = ExUtilGetInt(argv[(long)iVar3 + 4],0,(int *)local_158)
              ;
              iVar3 = iVar3 + 4;
              __s1 = local_160;
            }
            else {
              iVar4 = strcmp(__s1,"-scale");
              if (iVar4 == 0) {
                if (iVar3 < local_144) goto LAB_00102f42;
              }
              else {
                iVar4 = strcmp(__s1,"-resize");
                if (iVar4 == 0 && iVar3 < local_144) {
LAB_00102f42:
                  local_120.options.use_scaling = 1;
                  local_120.options.scaled_width =
                       ExUtilGetInt(argv[(long)iVar3 + 1],0,(int *)local_158);
                  local_120.options.scaled_height =
                       ExUtilGetInt(argv[(long)iVar3 + 2],0,(int *)local_158);
                  iVar3 = iVar3 + 2;
                  __s1 = local_160;
                  goto LAB_00102cd1;
                }
              }
              iVar4 = strcmp(__s1,"-flip");
              if (iVar4 == 0) {
                local_120.options.flip = 1;
                __s1 = local_160;
              }
              else {
                if (((cVar1 == '-') && (__s1[1] == 'v')) && (__s1[2] == '\0')) {
                  verbose = 1;
                  __s1 = local_160;
                  goto LAB_00102cd1;
                }
                iVar4 = strcmp(__s1,"-noasm");
                if (iVar4 == 0) {
                  VP8GetCPUInfo = (VP8CPUInfo)0x0;
                  __s1 = local_160;
                }
                else {
                  iVar4 = strcmp(__s1,"-incremental");
                  if (iVar4 == 0) {
                    local_140 = 1;
                    __s1 = local_160;
                  }
                  else if (cVar1 == '-') {
                    if ((__s1[1] != '-') || (__s1[2] != '\0')) {
                      main_cold_1();
                      return 1;
                    }
                    if (bVar2) {
                      local_160 = argv[(long)iVar3 + 1];
                    }
                    goto LAB_001030e6;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00102cd1:
  local_160 = __s1;
  iVar4 = iVar3;
  if (local_158[0] != 0) {
LAB_001035f7:
    puts(
        "Usage: dwebp in_file [options] [-o out_file]\n\nDecodes the WebP image file to PNG format [Default].\nNote: Animated WebP files are not supported.\n\nUse following options to convert into alternate image formats:\n  -pam ......... save the raw RGBA samples as a color PAM\n  -ppm ......... save the raw RGB samples as a color PPM\n  -bmp ......... save as uncompressed BMP format\n  -tiff ........ save as uncompressed TIFF format\n  -pgm ......... save the raw YUV samples as a grayscale PGM\n                 file with IMC4 layout\n  -yuv ......... save the raw YUV samples in flat layout\n\n Other options are:\n  -version ..... print version number and exit\n  -nofancy ..... don\'t use the fancy YUV420 upscaler\n  -nofilter .... disable in-loop filtering\n  -nodither .... disable dithering\n  -dither <d> .. dithering strength (in 0..100)\n  -alpha_dither  use alpha-plane dithering if needed\n  -mt .......... use multi-threading\n  -crop <x> <y> <w> <h> ... crop output with the given rectangle\n  -resize <w> <h> ......... resize output (*after* any cropping)\n  -flip ........ flip the output vertically\n  -alpha ....... only save the alpha plane\n  -incremental . use incremental decoding (useful for tests)\n  -h ........... this help message\n  -v ........... verbose (e.g. print encoding/decoding times)\n  -quiet ....... quiet mode, don\'t print anything\n  -noasm ....... disable all assembly optimizations"
        );
    return 1;
  }
LAB_00102cdc:
  iVar3 = iVar4 + 1;
  if (argc <= iVar3) goto LAB_001030e6;
  goto LAB_001029b3;
LAB_001030e6:
  if (local_160 != (char *)0x0) {
    if (quiet == '\x01') {
      verbose = 0;
    }
    local_128 = 0;
    iVar3 = LoadWebP(local_160,&local_138,&local_128,&local_120.input);
    if (iVar3 == 0) {
      return 1;
    }
    iVar3 = (*(code *)(&DAT_00180004 + *(int *)(&DAT_00180004 + local_180 * 4)))();
    return iVar3;
  }
LAB_00103156:
  main_cold_9();
  return 1;
}

Assistant:

int main(int argc, const char* argv[]) {
  int ok = 0;
  const char* in_file = NULL;
  const char* out_file = NULL;

  WebPDecoderConfig config;
  WebPDecBuffer* const output_buffer = &config.output;
  WebPBitstreamFeatures* const bitstream = &config.input;
  WebPOutputFileFormat format = PNG;
  uint8_t* external_buffer = NULL;
  int use_external_memory = 0;
  const uint8_t* data = NULL;

  int incremental = 0;
  int c;

  INIT_WARGV(argc, argv);

  if (!WebPInitDecoderConfig(&config)) {
    fprintf(stderr, "Library version mismatch!\n");
    FREE_WARGV_AND_RETURN(EXIT_FAILURE);
  }

  for (c = 1; c < argc; ++c) {
    int parse_error = 0;
    if (!strcmp(argv[c], "-h") || !strcmp(argv[c], "-help")) {
      Help();
      FREE_WARGV_AND_RETURN(EXIT_SUCCESS);
    } else if (!strcmp(argv[c], "-o") && c < argc - 1) {
      out_file = (const char*)GET_WARGV(argv, ++c);
    } else if (!strcmp(argv[c], "-alpha")) {
      format = ALPHA_PLANE_ONLY;
    } else if (!strcmp(argv[c], "-nofancy")) {
      config.options.no_fancy_upsampling = 1;
    } else if (!strcmp(argv[c], "-nofilter")) {
      config.options.bypass_filtering = 1;
    } else if (!strcmp(argv[c], "-pam")) {
      format = PAM;
    } else if (!strcmp(argv[c], "-ppm")) {
      format = PPM;
    } else if (!strcmp(argv[c], "-bmp")) {
      format = BMP;
    } else if (!strcmp(argv[c], "-tiff")) {
      format = TIFF;
    } else if (!strcmp(argv[c], "-quiet")) {
      quiet = 1;
    } else if (!strcmp(argv[c], "-version")) {
      const int version = WebPGetDecoderVersion();
      printf("%d.%d.%d\n",
             (version >> 16) & 0xff, (version >> 8) & 0xff, version & 0xff);
      FREE_WARGV_AND_RETURN(EXIT_SUCCESS);
    } else if (!strcmp(argv[c], "-pgm")) {
      format = PGM;
    } else if (!strcmp(argv[c], "-yuv")) {
      format = RAW_YUV;
    } else if (!strcmp(argv[c], "-pixel_format") && c < argc - 1) {
      const char* const fmt = argv[++c];
      if      (!strcmp(fmt, "RGB"))  format = RGB;
      else if (!strcmp(fmt, "RGBA")) format = RGBA;
      else if (!strcmp(fmt, "BGR"))  format = BGR;
      else if (!strcmp(fmt, "BGRA")) format = BGRA;
      else if (!strcmp(fmt, "ARGB")) format = ARGB;
      else if (!strcmp(fmt, "RGBA_4444")) format = RGBA_4444;
      else if (!strcmp(fmt, "RGB_565")) format = RGB_565;
      else if (!strcmp(fmt, "rgbA")) format = rgbA;
      else if (!strcmp(fmt, "bgrA")) format = bgrA;
      else if (!strcmp(fmt, "Argb")) format = Argb;
      else if (!strcmp(fmt, "rgbA_4444")) format = rgbA_4444;
      else if (!strcmp(fmt, "YUV"))  format = YUV;
      else if (!strcmp(fmt, "YUVA")) format = YUVA;
      else {
        fprintf(stderr, "Can't parse pixel_format %s\n", fmt);
        parse_error = 1;
      }
    } else if (!strcmp(argv[c], "-external_memory") && c < argc - 1) {
      use_external_memory = ExUtilGetInt(argv[++c], 0, &parse_error);
      parse_error |= (use_external_memory > 2 || use_external_memory < 0);
      if (parse_error) {
        fprintf(stderr, "Can't parse 'external_memory' value %s\n", argv[c]);
      }
    } else if (!strcmp(argv[c], "-mt")) {
      config.options.use_threads = 1;
    } else if (!strcmp(argv[c], "-alpha_dither")) {
      config.options.alpha_dithering_strength = 100;
    } else if (!strcmp(argv[c], "-nodither")) {
      config.options.dithering_strength = 0;
    } else if (!strcmp(argv[c], "-dither") && c < argc - 1) {
      config.options.dithering_strength =
          ExUtilGetInt(argv[++c], 0, &parse_error);
    } else if (!strcmp(argv[c], "-crop") && c < argc - 4) {
      config.options.use_cropping = 1;
      config.options.crop_left   = ExUtilGetInt(argv[++c], 0, &parse_error);
      config.options.crop_top    = ExUtilGetInt(argv[++c], 0, &parse_error);
      config.options.crop_width  = ExUtilGetInt(argv[++c], 0, &parse_error);
      config.options.crop_height = ExUtilGetInt(argv[++c], 0, &parse_error);
    } else if ((!strcmp(argv[c], "-scale") || !strcmp(argv[c], "-resize")) &&
               c < argc - 2) {  // '-scale' is left for compatibility
      config.options.use_scaling = 1;
      config.options.scaled_width  = ExUtilGetInt(argv[++c], 0, &parse_error);
      config.options.scaled_height = ExUtilGetInt(argv[++c], 0, &parse_error);
    } else if (!strcmp(argv[c], "-flip")) {
      config.options.flip = 1;
    } else if (!strcmp(argv[c], "-v")) {
      verbose = 1;
#ifndef WEBP_DLL
    } else if (!strcmp(argv[c], "-noasm")) {
      VP8GetCPUInfo = NULL;
#endif
    } else if (!strcmp(argv[c], "-incremental")) {
      incremental = 1;
    } else if (!strcmp(argv[c], "--")) {
      if (c < argc - 1) in_file = (const char*)GET_WARGV(argv, ++c);
      break;
    } else if (argv[c][0] == '-') {
      fprintf(stderr, "Unknown option '%s'\n", argv[c]);
      Help();
      FREE_WARGV_AND_RETURN(EXIT_FAILURE);
    } else {
      in_file = (const char*)GET_WARGV(argv, c);
    }

    if (parse_error) {
      Help();
      FREE_WARGV_AND_RETURN(EXIT_FAILURE);
    }
  }

  if (in_file == NULL) {
    fprintf(stderr, "missing input file!!\n");
    Help();
    FREE_WARGV_AND_RETURN(EXIT_FAILURE);
  }

  if (quiet) verbose = 0;

  {
    VP8StatusCode status = VP8_STATUS_OK;
    size_t data_size = 0;
    if (!LoadWebP(in_file, &data, &data_size, bitstream)) {
      FREE_WARGV_AND_RETURN(EXIT_FAILURE);
    }

    switch (format) {
      case PNG:
#ifdef HAVE_WINCODEC_H
        output_buffer->colorspace = bitstream->has_alpha ? MODE_BGRA : MODE_BGR;
#else
        output_buffer->colorspace = bitstream->has_alpha ? MODE_RGBA : MODE_RGB;
#endif
        break;
      case PAM:
        output_buffer->colorspace = MODE_RGBA;
        break;
      case PPM:
        output_buffer->colorspace = MODE_RGB;  // drops alpha for PPM
        break;
      case BMP:
        output_buffer->colorspace = bitstream->has_alpha ? MODE_BGRA : MODE_BGR;
        break;
      case TIFF:
        output_buffer->colorspace = bitstream->has_alpha ? MODE_RGBA : MODE_RGB;
        break;
      case PGM:
      case RAW_YUV:
        output_buffer->colorspace = bitstream->has_alpha ? MODE_YUVA : MODE_YUV;
        break;
      case ALPHA_PLANE_ONLY:
        output_buffer->colorspace = MODE_YUVA;
        break;
      // forced modes:
      case RGB: output_buffer->colorspace = MODE_RGB; break;
      case RGBA: output_buffer->colorspace = MODE_RGBA; break;
      case BGR: output_buffer->colorspace = MODE_BGR; break;
      case BGRA: output_buffer->colorspace = MODE_BGRA; break;
      case ARGB: output_buffer->colorspace = MODE_ARGB; break;
      case RGBA_4444: output_buffer->colorspace = MODE_RGBA_4444; break;
      case RGB_565: output_buffer->colorspace = MODE_RGB_565; break;
      case rgbA: output_buffer->colorspace = MODE_rgbA; break;
      case bgrA: output_buffer->colorspace = MODE_bgrA; break;
      case Argb: output_buffer->colorspace = MODE_Argb; break;
      case rgbA_4444: output_buffer->colorspace = MODE_rgbA_4444; break;
      case YUV: output_buffer->colorspace = MODE_YUV; break;
      case YUVA: output_buffer->colorspace = MODE_YUVA; break;
      default: goto Exit;
    }

    if (use_external_memory > 0 && format >= RGB) {
      external_buffer = AllocateExternalBuffer(&config, format,
                                               use_external_memory);
      if (external_buffer == NULL) goto Exit;
    }

    {
      Stopwatch stop_watch;
      if (verbose) StopwatchReset(&stop_watch);

      if (incremental) {
        status = DecodeWebPIncremental(data, data_size, &config);
      } else {
        status = DecodeWebP(data, data_size, &config);
      }
      if (verbose) {
        const double decode_time = StopwatchReadAndReset(&stop_watch);
        fprintf(stderr, "Time to decode picture: %.3fs\n", decode_time);
      }
    }

    ok = (status == VP8_STATUS_OK);
    if (!ok) {
      PrintWebPError(in_file, status);
      goto Exit;
    }
  }

  if (out_file != NULL) {
    if (!quiet) {
      WFPRINTF(stderr, "Decoded %s.", (const W_CHAR*)in_file);
      fprintf(stderr, " Dimensions: %d x %d %s. Format: %s. Now saving...\n",
              output_buffer->width, output_buffer->height,
              bitstream->has_alpha ? " (with alpha)" : "",
              kFormatType[bitstream->format]);
    }
    ok = SaveOutput(output_buffer, format, out_file);
  } else {
    if (!quiet) {
      WFPRINTF(stderr, "File %s can be decoded ", (const W_CHAR*)in_file);
      fprintf(stderr, "(dimensions: %d x %d %s. Format: %s).\n",
              output_buffer->width, output_buffer->height,
              bitstream->has_alpha ? " (with alpha)" : "",
              kFormatType[bitstream->format]);
      fprintf(stderr, "Nothing written; "
                      "use -o flag to save the result as e.g. PNG.\n");
    }
  }
 Exit:
  WebPFreeDecBuffer(output_buffer);
  WebPFree((void*)external_buffer);
  WebPFree((void*)data);
  FREE_WARGV_AND_RETURN(ok ? EXIT_SUCCESS : EXIT_FAILURE);
}